

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O1

void __thiscall Nes_Noise::run(Nes_Noise *this,nes_time_t time,nes_time_t end_time)

{
  byte bVar1;
  uchar uVar2;
  blip_ulong bVar3;
  Blip_Buffer *pBVar4;
  buf_t_ *pbVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  
  iVar13 = (int)noise_period_table[(this->super_Nes_Envelope).super_Nes_Osc.regs[2] & 0xf];
  pBVar4 = (this->super_Nes_Envelope).super_Nes_Osc.output;
  if (pBVar4 == (Blip_Buffer *)0x0) {
    iVar11 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
    iVar7 = (iVar13 + end_time) - iVar11;
    (this->super_Nes_Envelope).super_Nes_Osc.delay =
         (iVar11 - ((iVar7 + -1) % iVar13 + end_time)) + iVar7 + -1;
    return;
  }
  pBVar4->modified_ = 1;
  if ((this->super_Nes_Envelope).super_Nes_Osc.length_counter == 0) {
    uVar10 = 0;
  }
  else {
    bVar1 = (this->super_Nes_Envelope).super_Nes_Osc.regs[0];
    if ((bVar1 & 0x10) == 0) {
      uVar10 = (this->super_Nes_Envelope).envelope;
    }
    else {
      uVar10 = bVar1 & 0xf;
    }
  }
  iVar7 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
  uVar14 = -(this->noise & 1U) & uVar10;
  (this->super_Nes_Envelope).super_Nes_Osc.last_amp = uVar14;
  iVar7 = uVar14 - iVar7;
  if (iVar7 != 0) {
    Blip_Synth<8,_1>::offset(&this->synth,time,iVar7,pBVar4);
  }
  uVar15 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
  if ((int)uVar15 < end_time) {
    if (uVar10 == 0) {
      iVar7 = ~uVar15 + end_time + iVar13;
      uVar15 = (iVar7 - iVar7 % iVar13) + uVar15;
      if ((char)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] < '\0') goto LAB_0059a804;
      iVar13 = this->noise;
      uVar6 = iVar13 >> 1 | (iVar13 << 0xe ^ iVar13 << 0xd) & 0x4000U;
    }
    else {
      pBVar4 = (this->super_Nes_Envelope).super_Nes_Osc.output;
      bVar3 = pBVar4->factor_;
      uVar9 = bVar3 * uVar15 + pBVar4->offset_;
      uVar6 = this->noise;
      iVar7 = uVar14 * 2 - uVar10;
      uVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[2];
      do {
        if ((uVar6 + 1 & 2) != 0) {
          iVar7 = -iVar7;
          iVar11 = (this->synth).impl.delta_factor * iVar7;
          pbVar5 = pBVar4->buffer_;
          uVar12 = (ulong)(uVar9 >> 0x10);
          uVar8 = (ulong)(uVar9 >> 9 & 0x7e);
          pbVar5[uVar12 + 4] = pbVar5[uVar12 + 4] + *(short *)((long)this + (0xd8 - uVar8)) * iVar11
          ;
          pbVar5[uVar12 + 5] =
               pbVar5[uVar12 + 5] + *(short *)((long)this + (0x158 - uVar8)) * iVar11;
          pbVar5[uVar12 + 6] =
               pbVar5[uVar12 + 6] + *(short *)((long)this + (0x1d8 - uVar8)) * iVar11;
          pbVar5[uVar12 + 7] = pbVar5[uVar12 + 7] + *(short *)((long)this + (600 - uVar8)) * iVar11;
          pbVar5[uVar12 + 8] =
               pbVar5[uVar12 + 8] +
               *(short *)((long)(this->synth).impulses + uVar8 + 0x180) * iVar11;
          pbVar5[uVar12 + 9] =
               pbVar5[uVar12 + 9] +
               *(short *)((long)(this->synth).impulses + uVar8 + 0x100) * iVar11;
          pbVar5[uVar12 + 10] =
               pbVar5[uVar12 + 10] +
               *(short *)((long)(this->synth).impulses + uVar8 + 0x80) * iVar11;
          pbVar5[uVar12 + 0xb] =
               pbVar5[uVar12 + 0xb] + *(short *)((long)(this->synth).impulses + uVar8) * iVar11;
        }
        uVar15 = uVar15 + iVar13;
        uVar9 = uVar9 + bVar3 * iVar13;
        uVar6 = (int)uVar6 >> 1 | (uVar6 << (-1 < (char)uVar2) * '\x05' + 8 ^ uVar6 << 0xe) & 0x4000
        ;
      } while ((int)uVar15 < end_time);
      (this->super_Nes_Envelope).super_Nes_Osc.last_amp = (int)(iVar7 + uVar10) >> 1;
    }
    this->noise = uVar6;
  }
LAB_0059a804:
  (this->super_Nes_Envelope).super_Nes_Osc.delay = uVar15 - end_time;
  return;
}

Assistant:

void Nes_Noise::run( nes_time_t time, nes_time_t end_time )
{
	int period = noise_period_table [regs [2] & 15];
	
	if ( !output )
	{
		// TODO: clean up
		time += delay;
		delay = time + (end_time - time + period - 1) / period * period - end_time;
		return;
	}
	
	output->set_modified();
	
	const int volume = this->volume();
	int amp = (noise & 1) ? volume : 0;
	{
		int delta = update_amp( amp );
		if ( delta )
			synth.offset( time, delta, output );
	}
	
	time += delay;
	if ( time < end_time )
	{
		const int mode_flag = 0x80;
		
		if ( !volume )
		{
			// round to next multiple of period
			time += (end_time - time + period - 1) / period * period;
			
			// approximate noise cycling while muted, by shuffling up noise register
			// to do: precise muted noise cycling?
			if ( !(regs [2] & mode_flag) ) {
				int feedback = (noise << 13) ^ (noise << 14);
				noise = (feedback & 0x4000) | (noise >> 1);
			}
		}
		else
		{
			Blip_Buffer* const output = this->output;
			
			// using resampled time avoids conversion in synth.offset()
			blip_resampled_time_t rperiod = output->resampled_duration( period );
			blip_resampled_time_t rtime = output->resampled_time( time );
			
			int noise = this->noise;
			int delta = amp * 2 - volume;
			const int tap = (regs [2] & mode_flag ? 8 : 13);
			
			do {
				int feedback = (noise << tap) ^ (noise << 14);
				time += period;
				
				if ( (noise + 1) & 2 ) {
					// bits 0 and 1 of noise differ
					delta = -delta;
					synth.offset_resampled( rtime, delta, output );
				}
				
				rtime += rperiod;
				noise = (feedback & 0x4000) | (noise >> 1);
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->noise = noise;
		}
	}
	
	delay = time - end_time;
}